

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

VoxWriter *
vox::VoxWriter::Create
          (string *vFilePathName,uint32_t *vLimitX,uint32_t *vLimitY,uint32_t *vLimitZ,
          int32_t *vError)

{
  int32_t iVar1;
  VoxWriter *pVVar2;
  undefined8 uVar3;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  VoxWriter *local_40;
  VoxWriter *vox;
  int32_t *vError_local;
  uint32_t *vLimitZ_local;
  uint32_t *vLimitY_local;
  uint32_t *vLimitX_local;
  string *vFilePathName_local;
  
  vox = (VoxWriter *)vError;
  vError_local = (int32_t *)vLimitZ;
  vLimitZ_local = vLimitY;
  vLimitY_local = vLimitX;
  vLimitX_local = (uint32_t *)vFilePathName;
  pVVar2 = (VoxWriter *)operator_new(0x1a0);
  local_48 = (ulong)*vLimitY_local;
  local_50 = (ulong)*vLimitZ_local;
  local_58 = (ulong)(uint)*vError_local;
  VoxWriter(pVVar2,&stack0xffffffffffffffb8,&stack0xffffffffffffffb0,&stack0xffffffffffffffa8);
  local_40 = pVVar2;
  iVar1 = IsOk(pVVar2,(string *)vLimitX_local);
  vox->MV_VERSION = iVar1;
  if (vox->MV_VERSION == 0) {
    vFilePathName_local = (string *)local_40;
  }
  else {
    GetErrnoMsg_abi_cxx11_((VoxWriter *)&stack0xffffffffffffff78,&vox->MV_VERSION);
    uVar3 = std::__cxx11::string::c_str();
    printf("Vox file creation failed, err : %s",uVar3);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    pVVar2 = local_40;
    if (local_40 != (VoxWriter *)0x0) {
      if (local_40 != (VoxWriter *)0x0) {
        ~VoxWriter(local_40);
        operator_delete(pVVar2);
      }
      local_40 = (VoxWriter *)0x0;
    }
    vFilePathName_local = (string *)local_40;
  }
  return (VoxWriter *)vFilePathName_local;
}

Assistant:

VoxWriter* VoxWriter::Create(const std::string& vFilePathName, const uint32_t& vLimitX, const uint32_t& vLimitY, const uint32_t& vLimitZ, int32_t* vError) {
    VoxWriter* vox = new VoxWriter(vLimitX, vLimitY, vLimitZ);

    *vError = vox->IsOk(vFilePathName);

    if (*vError == 0) {
        return vox;
    } else {
        printf("Vox file creation failed, err : %s", GetErrnoMsg(*vError).c_str());

        SAFE_DELETE(vox);
    }

    return vox;
}